

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectivePosition::writeTempData(CDirectivePosition *this,TempData *tempData)

{
  int64_t iVar1;
  string sStack_38;
  
  if (this->type == Virtual) {
    iVar1 = this->virtualAddress;
    tinyformat::format<long>(&sStack_38,".org 0x%08X",&this->position);
    TempData::writeLine(tempData,iVar1,&sStack_38);
  }
  else {
    if (this->type != Physical) {
      return;
    }
    iVar1 = this->virtualAddress;
    tinyformat::format<long>(&sStack_38,".orga 0x%08X",&this->position);
    TempData::writeLine(tempData,iVar1,&sStack_38);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void CDirectivePosition::writeTempData(TempData& tempData) const
{
	switch (type)
	{
	case Physical:
		tempData.writeLine(virtualAddress,tfm::format(".orga 0x%08X",position));
		break;
	case Virtual:
		tempData.writeLine(virtualAddress,tfm::format(".org 0x%08X",position));
		break;
	}
}